

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::LogSumExp::forward_impl
          (LogSumExp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  initializer_list<unsigned_int> x;
  size_type sVar1;
  const_reference ppTVar2;
  ulong row;
  CoeffReturnType pfVar3;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Dim *in_RDI;
  float fVar4;
  Tensor v;
  Dim r;
  uint i;
  uint num_args;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Dim *d;
  Index in_stack_fffffffffffffef0;
  Tensor *in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  Tensor local_c8;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_ffffffffffffffb0;
  uint local_20;
  
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if ((int)sVar1 == 1) {
    ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    *(float **)(in_RDX + 0x28) = (*ppTVar2)->v;
  }
  else {
    local_20 = 0;
    while( true ) {
      row = (ulong)local_20;
      sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
      if (sVar1 <= row) break;
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                (in_RSI,(ulong)local_20);
      Tensor::operator*(in_stack_ffffffffffffff08);
      pfVar3 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             *)in_RDI,row,in_stack_fffffffffffffef0);
      *(float *)(*(long *)in_RDI[2].d + (ulong)local_20 * 4) = *pfVar3;
      local_20 = local_20 + 1;
    }
    sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
    local_7c = (undefined4)sVar1;
    local_78 = &local_7c;
    local_70 = 1;
    d = (Dim *)&stack0xffffffffffffff9c;
    x._M_len = in_stack_ffffffffffffff10;
    x._M_array = (iterator)in_stack_ffffffffffffff08;
    Dim::Dim(in_RDI,x);
    Tensor::Tensor(&local_c8,d,
                   (float *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    Tensor::operator*(in_stack_ffffffffffffff08);
    fVar4 = logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                      (in_stack_ffffffffffffffb0);
    **(float **)(in_RDX + 0x28) = fVar4;
    Tensor::~Tensor((Tensor *)0x60b902);
  }
  return;
}

Assistant:

void LogSumExp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  const unsigned num_args = xs.size();
  if (num_args == 1) {
    fx.v = xs[0]->v;
    return;
  }
  for (unsigned i = 0; i < xs.size(); ++i)
    static_cast<float*>(aux_mem)[i] = (**xs[i])(0,0);
  Dim r = {(unsigned int)xs.size()};
  Tensor v(r, static_cast<float*>(aux_mem));
  fx.v[0] = logsumexp(*v);
}